

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleTypeHandler<1UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<1UL> *this,Type *type,EquivalentPropertyEntry *entry)

{
  bool bVar1;
  PropertyIndex PVar2;
  uint16 uVar3;
  PropertyId PVar4;
  Type *this_00;
  PropertyRecord *this_01;
  PropertyIndex relSlotIndex;
  PropertyId propertyId;
  SimplePropertyDescriptor *descriptor;
  int i;
  EquivalentPropertyEntry *entry_local;
  Type *type_local;
  SimpleTypeHandler<1UL> *this_local;
  
  if (this->propertyCount < 1) {
    if ((entry->slotIndex != 0xffff) || ((entry->mustBeWritable & 1U) != 0)) {
      return false;
    }
  }
  else {
    for (descriptor._4_4_ = 0; descriptor._4_4_ < this->propertyCount;
        descriptor._4_4_ = descriptor._4_4_ + 1) {
      this_00 = this->descriptors + descriptor._4_4_;
      this_01 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->(&this_00->Id);
      PVar4 = PropertyRecord::GetPropertyId(this_01);
      if ((entry->propertyId == PVar4) && (((this_00->field_1).Attributes & 8) == 0)) {
        PVar2 = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                          (&this->super_DynamicTypeHandler,0);
        if (((PVar2 != entry->slotIndex) ||
            (bVar1 = entry->isAuxSlot,
            uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler),
            (bool)(bVar1 & 1U) != (uVar3 == 0))) ||
           (((entry->mustBeWritable & 1U) != 0 && (((this_00->field_1).Attributes & 4) == 0)))) {
          return false;
        }
      }
      else if ((entry->slotIndex != 0xffff) || ((entry->mustBeWritable & 1U) != 0)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const EquivalentPropertyEntry *entry)
    {
        if (this->propertyCount > 0)
        {
            for (int i = 0; i < this->propertyCount; i++)
            {
                SimplePropertyDescriptor* descriptor = &this->descriptors[i];
                Js::PropertyId propertyId = descriptor->Id->GetPropertyId();

                if (entry->propertyId == propertyId && !(descriptor->Attributes & PropertyDeleted))
                {
                    Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(0));
                    if (relSlotIndex != entry->slotIndex ||
                        entry->isAuxSlot != (GetInlineSlotCapacity() == 0) ||
                        (entry->mustBeWritable && !(descriptor->Attributes & PropertyWritable)))
                    {
                        return false;
                    }
                }
                else
                {
                    if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
                    {
                        return false;
                    }
                }
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }